

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void ImFontAtlasBuildFinish(ImFontAtlas *atlas)

{
  float fVar1;
  ImVec2 IVar2;
  ushort uVar3;
  ushort uVar4;
  uint *puVar5;
  uint *puVar6;
  ImFont *this;
  uint uVar11;
  ImFontAtlasCustomRect *pIVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  int iVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  long lVar16;
  uchar *__s;
  long lVar17;
  uint uVar18;
  int iVar19;
  ulong __n;
  int iVar22;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  long lVar23;
  undefined1 auVar24 [16];
  int iVar27;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  float fVar28;
  undefined1 auVar29 [16];
  int iVar30;
  undefined1 auVar31 [16];
  ImVec2 local_60;
  ImVec2 local_58;
  uint local_4c;
  long local_48;
  ulong local_40;
  ImVec4 *local_38;
  
  if ((atlas->TexPixelsAlpha8 == (uchar *)0x0) && (atlas->TexPixelsRGBA32 == (uint *)0x0)) {
    __assert_fail("atlas->TexPixelsAlpha8 != __null || atlas->TexPixelsRGBA32 != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/imgui-src/imgui_draw.cpp"
                  ,0xae0,"void ImFontAtlasBuildFinish(ImFontAtlas *)");
  }
  pIVar7 = ImFontAtlas::GetCustomRectByIndex(atlas,atlas->PackIdMouseCursors);
  uVar3 = pIVar7->X;
  if (uVar3 == 0xffff) {
    __assert_fail("r->IsPacked()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/imgui-src/imgui_draw.cpp"
                  ,0xa6f,"void ImFontAtlasBuildRenderDefaultTexData(ImFontAtlas *)");
  }
  if ((atlas->Flags & 2) == 0) {
    if ((pIVar7->Width != 0xf5) || (pIVar7->Height != 0x1b)) {
      __assert_fail("r->Width == FONT_ATLAS_DEFAULT_TEX_DATA_W * 2 + 1 && r->Height == FONT_ATLAS_DEFAULT_TEX_DATA_H"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/imgui-src/imgui_draw.cpp"
                    ,0xa75,"void ImFontAtlasBuildRenderDefaultTexData(ImFontAtlas *)");
    }
    if (atlas->TexPixelsAlpha8 == (uchar *)0x0) {
      ImFontAtlasBuildRender32bppRectFromString
                (atlas,(uint)uVar3,(uint)pIVar7->Y,0x7a,0x1b,
                 "..-         -XXXXXXX-    X    -           X           -XXXXXXX          -          XXXXXXX-     XX          - XX       XX ..-         -X.....X-   X.X   -          X.X          -X.....X          -          X.....X-    X..X         -X..X     X..X---         -XXX.XXX-  X...X  -         X...X         -X....X           -           X....X-    X..X         -X...X   X...XX           -  X.X  - X.....X -        X.....X        -X...X            -            X...X-    X..X         - X...X X...X XX          -  X.X  -X.......X-       X.......X       -X..X.X           -           X.X..X-    X..X         -  X...X...X  X.X         -  X.X  -XXXX.XXXX-       XXXX.XXXX       -X.X X.X          -          X.X X.X-    X..XXX       -   X.....X   X..X        -  X.X  -   X.X   -          X.X          -XX   X.X         -         X.X   XX-    X..X..XXX    -    X...X    X...X       -  X.X  -   X.X   -    XX    X.X    XX    -      X.X        -        X.X      -    X..X..X..XX  -     X.X     X....X      -  X.X  -   X.X   -   X.X    X.X    X.X   -       X.X       -       X.X       -    X..X..X..X.X -    X...X    X.....X     -  X.X  -   X.X   -  X..X    X.X    X..X  -        X.X      -      X.X        -XXX X..X..X..X..X-   X.....X   X......X    -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -         X.X   XX-XX   X.X         -X..XX........X..X-  X...X...X  X.......X   -  X.X  -   X.X   -X.....................X-          X.X X.X-X.X X.X          -X...X...........X- X...X X...X X........X  -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -           X.X..X-X..X.X           - X..............X-X...X   X...XX.........X -XXX.XXX-   X.X   -  X..X    X.X    X..X  -            X...X-X...X            -  X.............X-X..X     X..XX..........X-X.....X-   X.X   -   X.X    X.X    X.X   -           X....X-X....X           -  X.............X- XX       XX X......XXXXX-XXXXXXX-   X.X   -    XX    X.X    XX    -          X.....X-X.....X          -   X............X--------------X...X..X    ---------   X.X   -          X.X          -          XXXXXXX-XXXXXXX          -   X...." /* TRUNCATED STRING LITERAL */
                 ,'.',0xffffffff);
      ImFontAtlasBuildRender32bppRectFromString
                (atlas,uVar3 + 0x7b,(uint)pIVar7->Y,0x7a,0x1b,
                 "..-         -XXXXXXX-    X    -           X           -XXXXXXX          -          XXXXXXX-     XX          - XX       XX ..-         -X.....X-   X.X   -          X.X          -X.....X          -          X.....X-    X..X         -X..X     X..X---         -XXX.XXX-  X...X  -         X...X         -X....X           -           X....X-    X..X         -X...X   X...XX           -  X.X  - X.....X -        X.....X        -X...X            -            X...X-    X..X         - X...X X...X XX          -  X.X  -X.......X-       X.......X       -X..X.X           -           X.X..X-    X..X         -  X...X...X  X.X         -  X.X  -XXXX.XXXX-       XXXX.XXXX       -X.X X.X          -          X.X X.X-    X..XXX       -   X.....X   X..X        -  X.X  -   X.X   -          X.X          -XX   X.X         -         X.X   XX-    X..X..XXX    -    X...X    X...X       -  X.X  -   X.X   -    XX    X.X    XX    -      X.X        -        X.X      -    X..X..X..XX  -     X.X     X....X      -  X.X  -   X.X   -   X.X    X.X    X.X   -       X.X       -       X.X       -    X..X..X..X.X -    X...X    X.....X     -  X.X  -   X.X   -  X..X    X.X    X..X  -        X.X      -      X.X        -XXX X..X..X..X..X-   X.....X   X......X    -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -         X.X   XX-XX   X.X         -X..XX........X..X-  X...X...X  X.......X   -  X.X  -   X.X   -X.....................X-          X.X X.X-X.X X.X          -X...X...........X- X...X X...X X........X  -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -           X.X..X-X..X.X           - X..............X-X...X   X...XX.........X -XXX.XXX-   X.X   -  X..X    X.X    X..X  -            X...X-X...X            -  X.............X-X..X     X..XX..........X-X.....X-   X.X   -   X.X    X.X    X.X   -           X....X-X....X           -  X.............X- XX       XX X......XXXXX-XXXXXXX-   X.X   -    XX    X.X    XX    -          X.....X-X.....X          -   X............X--------------X...X..X    ---------   X.X   -          X.X          -          XXXXXXX-XXXXXXX          -   X...." /* TRUNCATED STRING LITERAL */
                 ,'X',0xffffffff);
    }
    else {
      ImFontAtlasBuildRender8bppRectFromString
                (atlas,(uint)uVar3,(uint)pIVar7->Y,0x7a,0x1b,
                 "..-         -XXXXXXX-    X    -           X           -XXXXXXX          -          XXXXXXX-     XX          - XX       XX ..-         -X.....X-   X.X   -          X.X          -X.....X          -          X.....X-    X..X         -X..X     X..X---         -XXX.XXX-  X...X  -         X...X         -X....X           -           X....X-    X..X         -X...X   X...XX           -  X.X  - X.....X -        X.....X        -X...X            -            X...X-    X..X         - X...X X...X XX          -  X.X  -X.......X-       X.......X       -X..X.X           -           X.X..X-    X..X         -  X...X...X  X.X         -  X.X  -XXXX.XXXX-       XXXX.XXXX       -X.X X.X          -          X.X X.X-    X..XXX       -   X.....X   X..X        -  X.X  -   X.X   -          X.X          -XX   X.X         -         X.X   XX-    X..X..XXX    -    X...X    X...X       -  X.X  -   X.X   -    XX    X.X    XX    -      X.X        -        X.X      -    X..X..X..XX  -     X.X     X....X      -  X.X  -   X.X   -   X.X    X.X    X.X   -       X.X       -       X.X       -    X..X..X..X.X -    X...X    X.....X     -  X.X  -   X.X   -  X..X    X.X    X..X  -        X.X      -      X.X        -XXX X..X..X..X..X-   X.....X   X......X    -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -         X.X   XX-XX   X.X         -X..XX........X..X-  X...X...X  X.......X   -  X.X  -   X.X   -X.....................X-          X.X X.X-X.X X.X          -X...X...........X- X...X X...X X........X  -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -           X.X..X-X..X.X           - X..............X-X...X   X...XX.........X -XXX.XXX-   X.X   -  X..X    X.X    X..X  -            X...X-X...X            -  X.............X-X..X     X..XX..........X-X.....X-   X.X   -   X.X    X.X    X.X   -           X....X-X....X           -  X.............X- XX       XX X......XXXXX-XXXXXXX-   X.X   -    XX    X.X    XX    -          X.....X-X.....X          -   X............X--------------X...X..X    ---------   X.X   -          X.X          -          XXXXXXX-XXXXXXX          -   X...." /* TRUNCATED STRING LITERAL */
                 ,'.',0xff);
      ImFontAtlasBuildRender8bppRectFromString
                (atlas,uVar3 + 0x7b,(uint)pIVar7->Y,0x7a,0x1b,
                 "..-         -XXXXXXX-    X    -           X           -XXXXXXX          -          XXXXXXX-     XX          - XX       XX ..-         -X.....X-   X.X   -          X.X          -X.....X          -          X.....X-    X..X         -X..X     X..X---         -XXX.XXX-  X...X  -         X...X         -X....X           -           X....X-    X..X         -X...X   X...XX           -  X.X  - X.....X -        X.....X        -X...X            -            X...X-    X..X         - X...X X...X XX          -  X.X  -X.......X-       X.......X       -X..X.X           -           X.X..X-    X..X         -  X...X...X  X.X         -  X.X  -XXXX.XXXX-       XXXX.XXXX       -X.X X.X          -          X.X X.X-    X..XXX       -   X.....X   X..X        -  X.X  -   X.X   -          X.X          -XX   X.X         -         X.X   XX-    X..X..XXX    -    X...X    X...X       -  X.X  -   X.X   -    XX    X.X    XX    -      X.X        -        X.X      -    X..X..X..XX  -     X.X     X....X      -  X.X  -   X.X   -   X.X    X.X    X.X   -       X.X       -       X.X       -    X..X..X..X.X -    X...X    X.....X     -  X.X  -   X.X   -  X..X    X.X    X..X  -        X.X      -      X.X        -XXX X..X..X..X..X-   X.....X   X......X    -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -         X.X   XX-XX   X.X         -X..XX........X..X-  X...X...X  X.......X   -  X.X  -   X.X   -X.....................X-          X.X X.X-X.X X.X          -X...X...........X- X...X X...X X........X  -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -           X.X..X-X..X.X           - X..............X-X...X   X...XX.........X -XXX.XXX-   X.X   -  X..X    X.X    X..X  -            X...X-X...X            -  X.............X-X..X     X..XX..........X-X.....X-   X.X   -   X.X    X.X    X.X   -           X....X-X....X           -  X.............X- XX       XX X......XXXXX-XXXXXXX-   X.X   -    XX    X.X    XX    -          X.....X-X.....X          -   X............X--------------X...X..X    ---------   X.X   -          X.X          -          XXXXXXX-XXXXXXX          -   X...." /* TRUNCATED STRING LITERAL */
                 ,'X',0xff);
    }
  }
  else {
    if ((pIVar7->Width != 2) || (pIVar7->Height != 2)) {
      __assert_fail("r->Width == 2 && r->Height == 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/imgui-src/imgui_draw.cpp"
                    ,0xa86,"void ImFontAtlasBuildRenderDefaultTexData(ImFontAtlas *)");
    }
    iVar12 = atlas->TexWidth;
    iVar13 = (uint)pIVar7->Y * iVar12 + (uint)uVar3;
    if (atlas->TexPixelsAlpha8 == (uchar *)0x0) {
      puVar5 = atlas->TexPixelsRGBA32;
      puVar6 = puVar5 + (iVar12 + iVar13);
      puVar6[0] = 0xffffffff;
      puVar6[1] = 0xffffffff;
      puVar5 = puVar5 + iVar13;
      puVar5[0] = 0xffffffff;
      puVar5[1] = 0xffffffff;
    }
    else {
      atlas->TexPixelsAlpha8[(long)(iVar12 + iVar13) + 1] = 0xff;
      atlas->TexPixelsAlpha8[iVar12 + iVar13] = 0xff;
      atlas->TexPixelsAlpha8[(long)iVar13 + 1] = 0xff;
      atlas->TexPixelsAlpha8[iVar13] = 0xff;
    }
  }
  uVar11._0_2_ = pIVar7->X;
  uVar11._2_2_ = pIVar7->Y;
  IVar2 = atlas->TexUvScale;
  (atlas->TexUvWhitePixel).x = IVar2.x * ((float)(uVar11 & 0xffff) + 0.5);
  (atlas->TexUvWhitePixel).y = IVar2.y * ((float)(uVar11 >> 0x10) + 0.5);
  if ((atlas->Flags & 4) == 0) {
    pIVar7 = ImFontAtlas::GetCustomRectByIndex(atlas,atlas->PackIdLines);
    uVar3 = pIVar7->X;
    if (uVar3 == 0xffff) {
      __assert_fail("r->IsPacked()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/imgui-src/imgui_draw.cpp"
                    ,0xa9b,"void ImFontAtlasBuildRenderLinesTexData(ImFontAtlas *)");
    }
    local_38 = atlas->TexUvLines;
    local_48 = 0;
    iVar12 = 0;
    iVar13 = 0;
    __n = 0;
    auVar31 = _DAT_001a6970;
    do {
      uVar11 = (uint)uVar3;
      if (pIVar7->Height <= __n) {
        __assert_fail("pad_left + line_width + pad_right == r->Width && y < r->Height",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/imgui-src/imgui_draw.cpp"
                      ,0xaa5,"void ImFontAtlasBuildRenderLinesTexData(ImFontAtlas *)");
      }
      uVar3 = pIVar7->Width;
      iVar19 = (int)__n;
      uVar8 = (uint)uVar3 - iVar19;
      uVar14 = uVar8 >> 1;
      uVar9 = (ulong)uVar14;
      uVar10 = uVar14 + iVar19;
      uVar15 = (uint)uVar3;
      if (atlas->TexPixelsAlpha8 == (uchar *)0x0) {
        puVar6 = atlas->TexPixelsRGBA32;
        uVar4 = pIVar7->Y;
        uVar18 = (uint)uVar4;
        iVar22 = atlas->TexWidth;
        if (1 < uVar8) {
          uVar8 = iVar13 + (uint)uVar3 >> 1;
          lVar16 = (ulong)(uVar8 + (uVar8 == 0)) - 1;
          auVar20._8_4_ = (int)lVar16;
          auVar20._0_8_ = lVar16;
          auVar20._12_4_ = (int)((ulong)lVar16 >> 0x20);
          lVar16 = (ulong)((iVar12 + (uint)uVar4) * iVar22 + uVar11) * 4;
          lVar17 = 0;
          auVar26 = _DAT_001afc50;
          auVar24 = _DAT_001afc40;
          do {
            auVar25 = auVar20 ^ auVar31;
            auVar29 = auVar26 ^ auVar31;
            iVar27 = auVar25._4_4_;
            if ((bool)(~(iVar27 < auVar29._4_4_ ||
                        auVar25._0_4_ < auVar29._0_4_ && auVar29._4_4_ == iVar27) & 1)) {
              *(undefined4 *)((long)puVar6 + lVar17 + lVar16) = 0xffffff;
            }
            if (auVar29._12_4_ <= auVar25._12_4_ &&
                (auVar29._8_4_ <= auVar25._8_4_ || auVar29._12_4_ != auVar25._12_4_)) {
              *(undefined4 *)((long)puVar6 + lVar17 + lVar16 + 4) = 0xffffff;
            }
            iVar30 = SUB164(auVar24 ^ auVar31,4);
            if (iVar30 <= iVar27 &&
                (iVar30 != iVar27 || SUB164(auVar24 ^ auVar31,0) <= auVar25._0_4_)) {
              *(undefined4 *)((long)puVar6 + lVar17 + lVar16 + 8) = 0xffffff;
              *(undefined4 *)((long)puVar6 + lVar17 + lVar16 + 0xc) = 0xffffff;
            }
            lVar23 = auVar26._8_8_;
            auVar26._0_8_ = auVar26._0_8_ + 4;
            auVar26._8_8_ = lVar23 + 4;
            lVar23 = auVar24._8_8_;
            auVar24._0_8_ = auVar24._0_8_ + 4;
            auVar24._8_8_ = lVar23 + 4;
            lVar17 = lVar17 + 0x10;
          } while ((ulong)(uVar8 + (uVar8 == 0) + 3 & 0xfffffffc) << 2 != lVar17);
        }
        if (__n != 0) {
          local_4c = uVar11;
          local_40 = (ulong)uVar4;
          memset(puVar6 + (((uint)uVar4 + iVar19) * iVar22 + uVar11) + uVar9,0xff,__n * 4);
          uVar18 = (uint)local_40;
          auVar31 = _DAT_001a6970;
          uVar11 = local_4c;
        }
        if (uVar3 != uVar10) {
          uVar8 = uVar15 + iVar13 >> 1;
          uVar10 = (uVar15 + iVar13) - uVar8;
          lVar16 = (ulong)(uVar10 + (uVar10 == 0)) - 1;
          auVar21._8_4_ = (int)lVar16;
          auVar21._0_8_ = lVar16;
          auVar21._12_4_ = (int)((ulong)lVar16 >> 0x20);
          lVar16 = local_48 + (ulong)uVar8 * 4 + (ulong)(iVar22 * (uVar18 + iVar12) + uVar11) * 4;
          auVar21 = auVar21 ^ auVar31;
          uVar9 = 0;
          auVar25 = _DAT_001afc50;
          auVar29 = _DAT_001afc40;
          do {
            auVar26 = auVar25 ^ auVar31;
            iVar22 = auVar21._4_4_;
            if ((bool)(~(auVar26._4_4_ == iVar22 && auVar21._0_4_ < auVar26._0_4_ ||
                        iVar22 < auVar26._4_4_) & 1)) {
              *(undefined4 *)((long)puVar6 + uVar9 + lVar16) = 0xffffff;
            }
            if ((auVar26._12_4_ != auVar21._12_4_ || auVar26._8_4_ <= auVar21._8_4_) &&
                auVar26._12_4_ <= auVar21._12_4_) {
              *(undefined4 *)((long)puVar6 + uVar9 + lVar16 + 4) = 0xffffff;
            }
            iVar27 = SUB164(auVar29 ^ auVar31,4);
            if (iVar27 <= iVar22 &&
                (iVar27 != iVar22 || SUB164(auVar29 ^ auVar31,0) <= auVar21._0_4_)) {
              *(undefined4 *)((long)puVar6 + uVar9 + lVar16 + 8) = 0xffffff;
              *(undefined4 *)((long)puVar6 + uVar9 + lVar16 + 0xc) = 0xffffff;
            }
            lVar17 = auVar25._8_8_;
            auVar25._0_8_ = auVar25._0_8_ + 4;
            auVar25._8_8_ = lVar17 + 4;
            lVar17 = auVar29._8_8_;
            auVar29._0_8_ = auVar29._0_8_ + 4;
            auVar29._8_8_ = lVar17 + 4;
            uVar9 = uVar9 + 0x10;
          } while ((((ulong)uVar10 + (ulong)((ulong)uVar10 == 0)) * 4 + 0xc & 0x7fffffff0) != uVar9)
          ;
        }
      }
      else {
        __s = atlas->TexPixelsAlpha8 + (((uint)pIVar7->Y + iVar19) * atlas->TexWidth + uVar11);
        if (1 < uVar8) {
          memset(__s,0,uVar9);
          auVar31 = _DAT_001a6970;
        }
        if (__n != 0) {
          memset(__s + uVar9,0xff,__n);
          auVar31 = _DAT_001a6970;
        }
        if (uVar15 != uVar10) {
          memset(__s + uVar9 + __n,0,(ulong)((uVar15 - uVar10) + (uint)(uVar15 - uVar10 == 0)));
          auVar31 = _DAT_001a6970;
        }
      }
      uVar3 = pIVar7->X;
      uVar4 = pIVar7->Y;
      fVar1 = (atlas->TexUvScale).x;
      fVar28 = (atlas->TexUvScale).y;
      uVar9 = __n + 1;
      local_38[__n].x = (float)((uVar14 + uVar3) - 1) * fVar1;
      fVar28 = ((float)(int)(uVar4 + 1 + iVar19) * fVar28 +
               (float)(int)((uint)uVar4 + iVar19) * fVar28) * 0.5;
      local_38[__n].y = fVar28;
      local_38[__n].z = fVar1 * (float)((int)uVar9 + (uint)uVar3 + uVar14);
      local_38[__n].w = fVar28;
      iVar13 = iVar13 + -1;
      iVar12 = iVar12 + 1;
      local_48 = local_48 + 4;
      __n = uVar9;
    } while (uVar9 != 0x40);
  }
  iVar12 = (atlas->CustomRects).Size;
  if (0 < iVar12) {
    lVar16 = 0;
    lVar17 = 0;
    do {
      pIVar7 = (atlas->CustomRects).Data;
      lVar23 = *(long *)((long)&pIVar7->Font + lVar16);
      if ((lVar23 != 0) && (*(int *)((long)&pIVar7->GlyphID + lVar16) != 0)) {
        if (*(ImFontAtlas **)(lVar23 + 0x40) != atlas) {
          __assert_fail("r->Font->ContainerAtlas == atlas",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/imgui-src/imgui_draw.cpp"
                        ,0xaec,"void ImFontAtlasBuildFinish(ImFontAtlas *)");
        }
        local_58.x = 0.0;
        local_58.y = 0.0;
        local_60.x = 0.0;
        local_60.y = 0.0;
        ImFontAtlas::CalcCustomRectUV
                  (atlas,(ImFontAtlasCustomRect *)((long)&pIVar7->Width + lVar16),&local_58,
                   &local_60);
        fVar1 = *(float *)((long)&(pIVar7->GlyphOffset).x + lVar16);
        fVar28 = *(float *)((long)&(pIVar7->GlyphOffset).y + lVar16);
        ImFont::AddGlyph(*(ImFont **)((long)&pIVar7->Font + lVar16),(ImFontConfig *)0x0,
                         *(ImWchar *)((long)&pIVar7->GlyphID + lVar16),fVar1,fVar28,
                         (float)*(ushort *)((long)&pIVar7->Width + lVar16) + fVar1,
                         (float)*(ushort *)((long)&pIVar7->Height + lVar16) + fVar28,local_58.x,
                         local_58.y,local_60.x,local_60.y,
                         *(float *)((long)&pIVar7->GlyphAdvanceX + lVar16));
        iVar12 = (atlas->CustomRects).Size;
      }
      lVar17 = lVar17 + 1;
      lVar16 = lVar16 + 0x20;
    } while (lVar17 < iVar12);
  }
  iVar12 = (atlas->Fonts).Size;
  if (0 < iVar12) {
    lVar16 = 0;
    do {
      this = (atlas->Fonts).Data[lVar16];
      if (this->DirtyLookupTables == true) {
        ImFont::BuildLookupTable(this);
        iVar12 = (atlas->Fonts).Size;
      }
      lVar16 = lVar16 + 1;
    } while (lVar16 < iVar12);
  }
  atlas->TexReady = true;
  return;
}

Assistant:

void ImFontAtlasBuildFinish(ImFontAtlas* atlas)
{
    // Render into our custom data blocks
    IM_ASSERT(atlas->TexPixelsAlpha8 != NULL || atlas->TexPixelsRGBA32 != NULL);
    ImFontAtlasBuildRenderDefaultTexData(atlas);
    ImFontAtlasBuildRenderLinesTexData(atlas);

    // Register custom rectangle glyphs
    for (int i = 0; i < atlas->CustomRects.Size; i++)
    {
        const ImFontAtlasCustomRect* r = &atlas->CustomRects[i];
        if (r->Font == NULL || r->GlyphID == 0)
            continue;

        // Will ignore ImFontConfig settings: GlyphMinAdvanceX, GlyphMinAdvanceY, GlyphExtraSpacing, PixelSnapH
        IM_ASSERT(r->Font->ContainerAtlas == atlas);
        ImVec2 uv0, uv1;
        atlas->CalcCustomRectUV(r, &uv0, &uv1);
        r->Font->AddGlyph(NULL, (ImWchar)r->GlyphID, r->GlyphOffset.x, r->GlyphOffset.y, r->GlyphOffset.x + r->Width, r->GlyphOffset.y + r->Height, uv0.x, uv0.y, uv1.x, uv1.y, r->GlyphAdvanceX);
    }

    // Build all fonts lookup tables
    for (int i = 0; i < atlas->Fonts.Size; i++)
        if (atlas->Fonts[i]->DirtyLookupTables)
            atlas->Fonts[i]->BuildLookupTable();

    atlas->TexReady = true;
}